

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

int Lodtalk::Behavior::stBasicNewSize(InterpreterProxy *interpreter)

{
  Oop OVar1;
  int iVar2;
  undefined4 extraout_var;
  Behavior *this;
  VMContext *context;
  size_t indexableSize;
  Object *pointer;
  Oop OVar3;
  Behavior *self;
  Oop size;
  InterpreterProxy *interpreter_local;
  
  size.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)interpreter;
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) == 1) {
    self = (Behavior *)(**(code **)(*(long *)size.field_0 + 0xe0))(size.field_0,0);
    this = (Behavior *)(**(code **)(*(long *)size.field_0 + 0x58))();
    OVar1 = size;
    context = (VMContext *)(*(code *)**(undefined8 **)size.field_0)();
    indexableSize = Oop::decodeSmallInteger((Oop *)&self);
    pointer = basicNativeNew(this,context,indexableSize);
    OVar3 = Oop::fromPointer(pointer);
    interpreter_local._4_4_ =
         (**(code **)(*(long *)OVar1.field_0 + 0xb8))(OVar1.field_0,OVar3.field_0);
  }
  else {
    interpreter_local._4_4_ = (**(code **)(*(long *)size.field_0 + 0xf0))();
  }
  return interpreter_local._4_4_;
}

Assistant:

int Behavior::stBasicNewSize(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    Oop size = interpreter->getTemporary(0);
    auto self = reinterpret_cast<Behavior*> (interpreter->getReceiver().pointer);
    return interpreter->returnOop(Oop::fromPointer(self->basicNativeNew(interpreter->getContext(), size.decodeSmallInteger())));
}